

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

void Tas_ManStop(Tas_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *__ptr;
  int *__ptr_00;
  Gia_Obj_t **ppGVar2;
  
  pVVar1 = p->vActiveVars;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vWatchLits;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLevReas;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vModel;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->vTemp;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (p->pActivity != (float *)0x0) {
    free(p->pActivity);
    p->pActivity = (float *)0x0;
  }
  if (p->pWatches != (int *)0x0) {
    free(p->pWatches);
    p->pWatches = (int *)0x0;
  }
  __ptr_00 = (p->pStore).pData;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
    (p->pStore).pData = (int *)0x0;
  }
  ppGVar2 = (p->pClauses).pData;
  if (ppGVar2 != (Gia_Obj_t **)0x0) {
    free(ppGVar2);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar2 = (p->pProp).pData;
  if (ppGVar2 != (Gia_Obj_t **)0x0) {
    free(ppGVar2);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar2 = (p->pJust).pData;
  if (ppGVar2 != (Gia_Obj_t **)0x0) {
    free(ppGVar2);
    (p->pJust).pData = (Gia_Obj_t **)0x0;
  }
  if (p != (Tas_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Tas_ManStop( Tas_Man_t * p )
{
    Vec_IntFree( p->vActiveVars );
    Vec_IntFree( p->vWatchLits );
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pActivity );
    ABC_FREE( p->pWatches );
    ABC_FREE( p->pStore.pData );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}